

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O0

void __thiscall FixedSizeCache<double>::FixedSizeCache(FixedSizeCache<double> *this,int size)

{
  int size_local;
  FixedSizeCache<double> *this_local;
  
  this->_count = 0;
  std::vector<double,_std::allocator<double>_>::vector(&this->_data);
  initialize(this,size);
  return;
}

Assistant:

FixedSizeCache(int const size = 1000) :
        _count(0)
    {
        this->initialize(size);
    }